

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grapheme.cpp
# Opt level: O2

void __thiscall unicpp::grapheme::grapheme(grapheme *this,u32string *codepoints)

{
  pointer pcVar1;
  utf8proc_bool uVar2;
  invalid_grapheme_exception *this_00;
  size_t i;
  ulong uVar3;
  utf8proc_int32_t state;
  
  std::__cxx11::u32string::u32string((u32string *)this,codepoints);
  state = 0;
  uVar3 = 0;
  do {
    if ((this->m_codepoints)._M_string_length - 1 <= uVar3) {
      return;
    }
    pcVar1 = (this->m_codepoints)._M_dataplus._M_p;
    uVar2 = utf8proc_grapheme_break_stateful(pcVar1[uVar3],pcVar1[uVar3 + 1],&state);
    uVar3 = uVar3 + 1;
  } while (!uVar2);
  this_00 = (invalid_grapheme_exception *)__cxa_allocate_exception(0x10);
  invalid_grapheme_exception::invalid_grapheme_exception
            (this_00,"Found an grapheme break in a grapheme!");
  __cxa_throw(this_00,&invalid_grapheme_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

grapheme::grapheme(const std::u32string & codepoints) :
    m_codepoints(codepoints)
{
    //Check if it's a single grapheme
    utf8proc_int32_t state = 0;
    for(std::size_t i = 0; i < m_codepoints.size() - 1; ++i)
    {
        if(utf8proc_grapheme_break_stateful(m_codepoints[i], m_codepoints[i + 1], &state))
            throw invalid_grapheme_exception("Found an grapheme break in a grapheme!");
    }
}